

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void dec_parse_sao_param(com_core_t *core,int lcu_idx,com_sao_param_t *sao_cur_param)

{
  char cVar1;
  com_seqh_t *pcVar2;
  int iVar3;
  com_lbac_t *lbac_00;
  uint local_54;
  uint local_50;
  int local_4c;
  int local_48;
  int compIdx;
  int mergemode;
  int MergeLeftAvail;
  int MergeUpAvail;
  int cur_patch;
  com_lbac_t *lbac;
  com_seqh_t *seqhdr;
  com_patch_header_t *sh;
  com_sao_param_t *sao_cur_param_local;
  int lcu_idx_local;
  com_core_t *core_local;
  
  if ((((core->pathdr).slice_sao_enable[0] == '\0') && ((core->pathdr).slice_sao_enable[1] == '\0'))
     && ((core->pathdr).slice_sao_enable[2] == '\0')) {
    sao_cur_param->enable = 0;
    sao_cur_param[1].enable = 0;
    sao_cur_param[2].enable = 0;
  }
  else {
    pcVar2 = core->seqhdr;
    lbac_00 = &core->lbac;
    cVar1 = (core->map).map_patch[lcu_idx];
    if (core->lcu_y == 0) {
      local_50 = 0;
    }
    else {
      local_50 = (uint)(cVar1 == (core->map).map_patch[lcu_idx - pcVar2->pic_width_in_lcu]);
    }
    if (core->lcu_x == 0) {
      local_54 = 0;
    }
    else {
      local_54 = (uint)(cVar1 == (core->map).map_patch[lcu_idx + -1]);
    }
    local_48 = 0;
    if (local_54 + local_50 != 0) {
      local_48 = dec_parse_sao_mergeflag(lbac_00,local_54,local_50);
    }
    if (local_48 == 0) {
      for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
        if ((core->pathdr).slice_sao_enable[local_4c] == '\0') {
          sao_cur_param[local_4c].enable = 0;
        }
        else {
          iVar3 = dec_parse_sao_mode(lbac_00);
          if (iVar3 == 0) {
            sao_cur_param[local_4c].enable = 0;
          }
          else if (iVar3 == 1) {
            sao_cur_param[local_4c].enable = 1;
            sao_cur_param[local_4c].type = 4;
          }
          else if (iVar3 == 2) {
            sao_cur_param[local_4c].enable = 1;
            sao_cur_param[local_4c].type = 0;
          }
          if (sao_cur_param[local_4c].enable != 0) {
            dec_parse_sao_offset(lbac_00,sao_cur_param + local_4c,sao_cur_param[local_4c].offset);
            if (sao_cur_param[local_4c].type == 4) {
              dec_parse_sao_bo_start
                        (lbac_00,sao_cur_param + local_4c,sao_cur_param[local_4c].bandIdx);
            }
            else {
              iVar3 = dec_parse_sao_eo_type(lbac_00,sao_cur_param + local_4c);
              sao_cur_param[local_4c].type = iVar3;
            }
          }
        }
      }
    }
    else if (local_48 == 2) {
      copy_sao_param(sao_cur_param,core->sao_param_map[lcu_idx + -1]);
    }
    else {
      copy_sao_param(sao_cur_param,core->sao_param_map[lcu_idx - pcVar2->pic_width_in_lcu]);
    }
  }
  return;
}

Assistant:

void dec_parse_sao_param(com_core_t* core, int lcu_idx, com_sao_param_t *sao_cur_param)
{
    com_patch_header_t *sh = &core->pathdr;

    if (!sh->slice_sao_enable[Y_C] && !sh->slice_sao_enable[U_C] && !sh->slice_sao_enable[V_C]) {
        sao_cur_param[0].enable = 0;
        sao_cur_param[1].enable = 0;
        sao_cur_param[2].enable = 0;
    } else {
        com_seqh_t *seqhdr = core->seqhdr;
        com_lbac_t *lbac = &core->lbac;
        int cur_patch = core->map.map_patch[lcu_idx];
        int MergeUpAvail   = (core->lcu_y == 0) ? 0 : cur_patch == core->map.map_patch[lcu_idx - seqhdr->pic_width_in_lcu];
        int MergeLeftAvail = (core->lcu_x == 0) ? 0 : cur_patch == core->map.map_patch[lcu_idx -                      1];
        int mergemode = 0;

        if (MergeLeftAvail + MergeUpAvail > 0) {
            mergemode = dec_parse_sao_mergeflag(lbac, MergeLeftAvail, MergeUpAvail);
        }
        if (mergemode) {
            if (mergemode == 2) {
                copy_sao_param(sao_cur_param, core->sao_param_map[lcu_idx - 1]);
            } else {
                copy_sao_param(sao_cur_param, core->sao_param_map[lcu_idx - seqhdr->pic_width_in_lcu]);
            }
        } else {
            int compIdx;

            for (compIdx = Y_C; compIdx < N_C; compIdx++) {
                if (!sh->slice_sao_enable[compIdx]) {
                    sao_cur_param[compIdx].enable = 0;
                } else {
                    switch (dec_parse_sao_mode(lbac)) {
                    case 0:
                        sao_cur_param[compIdx].enable = 0;
                        break;
                    case 1:
                        sao_cur_param[compIdx].enable = 1;
                        sao_cur_param[compIdx].type = SAO_TYPE_BO;
                        break;
                    case 2:
                        sao_cur_param[compIdx].enable = 1;
                        sao_cur_param[compIdx].type = SAO_TYPE_EO_0;
                        break;
                    default:
                        uavs3d_assert(0);
                        break;
                    }

                    if (sao_cur_param[compIdx].enable) {
                        dec_parse_sao_offset(lbac, &(sao_cur_param[compIdx]), sao_cur_param[compIdx].offset);

                        if (sao_cur_param[compIdx].type == SAO_TYPE_BO) {
                            dec_parse_sao_bo_start(lbac, &(sao_cur_param[compIdx]), sao_cur_param[compIdx].bandIdx);
                        } else {
                            sao_cur_param[compIdx].type = dec_parse_sao_eo_type(lbac, &(sao_cur_param[compIdx]));
                        }
                    }
                }
            }
        }
    }
}